

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitV128BitSelect(WasmBytecodeGenerator *this)

{
  RegSlot RVar1;
  EmitInfo EVar2;
  EmitInfo EVar3;
  EmitInfo EVar4;
  RegisterSpace *this_00;
  EmitInfo local_50;
  EmitInfo arg2Info;
  EmitInfo arg1Info;
  EmitInfo mask;
  
  EVar2 = PopEvalStack(this,V128,(char16 *)0x0);
  arg1Info = EVar2;
  EVar3 = PopEvalStack(this,V128,(char16 *)0x0);
  local_50 = EVar3;
  EVar4 = PopEvalStack(this,V128,(char16 *)0x0);
  arg2Info = EVar4;
  ReleaseLocation(this,&arg1Info);
  ReleaseLocation(this,&local_50);
  ReleaseLocation(this,&arg2Info);
  Simd::EnsureSimdIsEnabled();
  this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,SIMD);
  RVar1 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,0x126,(ulong)RVar1,(ulong)EVar4 & 0xffffffff,(ulong)EVar3 & 0xffffffff,
             EVar2);
  return (EmitInfo)((ulong)RVar1 | 0x500000000);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitV128BitSelect()
{
    EmitInfo mask = PopEvalStack(WasmTypes::V128);
    EmitInfo arg2Info = PopEvalStack(WasmTypes::V128);
    EmitInfo arg1Info = PopEvalStack(WasmTypes::V128);

    ReleaseLocation(&mask);
    ReleaseLocation(&arg2Info);
    ReleaseLocation(&arg1Info);

    Js::RegSlot resultReg = GetRegisterSpace(WasmTypes::V128)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, WasmTypes::V128);
    m_writer->AsmReg4(Js::OpCodeAsmJs::Simd128_BitSelect_I4, resultReg, arg1Info.location, arg2Info.location, mask.location);
    return resultInfo;
}